

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int checkTreePage(IntegrityCk *pCheck,int iPage,char *zParentContext,i64 *pnParentMinKey,
                 i64 *pnParentMaxKey)

{
  byte bVar1;
  byte bVar2;
  BtShared *pBt;
  u8 *puVar3;
  IntegrityCk *pCheck_00;
  i64 iVar4;
  ushort uVar5;
  u16 uVar6;
  int iVar7;
  uint uVar8;
  void *__s;
  int iVar9;
  long lVar10;
  char *pcVar11;
  i64 *piVar12;
  u32 uVar13;
  ulong uVar14;
  long *plVar15;
  uint uVar16;
  uint *pCell;
  i64 nMaxKey;
  i64 nMinKey;
  MemPage *pPage;
  CellInfo info;
  char zContext [100];
  i64 local_100;
  void *local_f8;
  long *local_f0;
  ulong local_e8;
  IntegrityCk *local_e0;
  long *local_d8;
  i64 local_d0;
  ulong local_c8;
  MemPage *local_c0;
  CellInfo local_b8;
  char local_98 [104];
  
  local_d0 = 0;
  local_100 = 0;
  sqlite3_snprintf(100,local_98,"Page %d: ");
  if (iPage == 0) {
    return 0;
  }
  pBt = pCheck->pBt;
  uVar16 = pBt->usableSize;
  local_f0 = pnParentMaxKey;
  local_d8 = pnParentMinKey;
  iVar7 = checkRef(pCheck,iPage,zParentContext);
  if (iVar7 != 0) {
    return 0;
  }
  uVar8 = btreeGetPage(pBt,iPage,&local_c0,0,0);
  if (uVar8 != 0) {
    checkAppendMsg(pCheck,local_98,"unable to get the page. error code=%d",(ulong)uVar8);
    return 0;
  }
  local_c0->isInit = '\0';
  uVar8 = btreeInitPage(local_c0);
  if (uVar8 != 0) {
    iVar7 = 0;
    checkAppendMsg(pCheck,local_98,"btreeInitPage() returns error code %d",(ulong)uVar8);
    goto LAB_00146db8;
  }
  local_e8 = (ulong)uVar16;
  if (local_c0->nCell == 0) {
    iVar7 = 1;
  }
  else {
    local_e0 = (IntegrityCk *)CONCAT44(local_e0._4_4_,uVar16 - 5);
    local_f8 = (void *)CONCAT44(local_f8._4_4_,uVar16 - 4);
    uVar14 = 0;
    iVar7 = 0;
    do {
      if (pCheck->mxErr == 0) break;
      sqlite3_snprintf(100,local_98,"On tree page %d cell %d: ",(ulong)(uint)iPage,
                       uVar14 & 0xffffffff);
      pCell = (uint *)(local_c0->aData +
                      (CONCAT11(local_c0->aCellIdx[uVar14 * 2],local_c0->aCellIdx[uVar14 * 2 + 1]) &
                      local_c0->maskPage));
      btreeParseCellPtr(local_c0,(u8 *)pCell,&local_b8);
      uVar13 = local_b8.nData;
      if (local_c0->intKey == '\0') {
        uVar13 = local_b8.nData + (int)local_b8.nKey;
        lVar10 = local_100;
        iVar4 = local_d0;
      }
      else {
        lVar10 = CONCAT44(local_b8.nKey._4_4_,(int)local_b8.nKey);
        iVar4 = lVar10;
        if ((uVar14 != 0) && (iVar4 = local_d0, lVar10 <= local_100)) {
          checkAppendMsg(pCheck,local_98,"Rowid %lld out of order (previous was %lld)",lVar10);
          iVar4 = local_d0;
        }
      }
      local_d0 = iVar4;
      local_100 = lVar10;
      if ((local_b8.nLocal < uVar13) &&
         ((uint *)((ulong)local_b8.iOverflow + (long)pCell) <= local_c0->aData + pBt->usableSize)) {
        uVar8 = ((uVar13 + (int)local_e0) - (uint)local_b8.nLocal) / (uint)local_f8;
        uVar16 = *(uint *)((ulong)local_b8.iOverflow + (long)pCell);
        uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18
        ;
        if (pBt->autoVacuum != '\0') {
          checkPtrmap(pCheck,uVar16,'\x03',iPage,local_98);
        }
        checkList(pCheck,0,uVar16,uVar8,local_98);
      }
      iVar9 = iVar7;
      if (local_c0->leaf == '\0') {
        uVar16 = *pCell;
        uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18
        ;
        if (pBt->autoVacuum != '\0') {
          checkPtrmap(pCheck,uVar16,'\x05',iPage,local_98);
        }
        piVar12 = &local_100;
        if (uVar14 == 0) {
          piVar12 = (i64 *)0x0;
        }
        iVar9 = checkTreePage(pCheck,uVar16,local_98,&local_d0,piVar12);
        if ((uVar14 != 0) && (iVar9 != iVar7)) {
          checkAppendMsg(pCheck,local_98,"Child page depth differs");
        }
      }
      iVar7 = iVar9;
      uVar14 = uVar14 + 1;
    } while (uVar14 < local_c0->nCell);
    iVar7 = iVar7 + 1;
  }
  if (local_c0->leaf == '\0') {
    uVar16 = *(uint *)(local_c0->aData + (ulong)local_c0->hdrOffset + 8);
    uVar16 = uVar16 >> 0x18 | (uVar16 & 0xff0000) >> 8 | (uVar16 & 0xff00) << 8 | uVar16 << 0x18;
    sqlite3_snprintf(100,local_98,"On page %d at right child: ");
    if (pBt->autoVacuum != '\0') {
      checkPtrmap(pCheck,uVar16,'\x05',iPage,local_98);
    }
    piVar12 = &local_100;
    if (local_c0->nCell == 0) {
      piVar12 = (i64 *)0x0;
    }
    checkTreePage(pCheck,uVar16,local_98,(i64 *)0x0,piVar12);
  }
  if ((local_c0->leaf != '\0') && (local_c0->intKey != '\0')) {
    if (local_d8 == (long *)0x0) {
      if ((local_f0 != (long *)0x0) && (local_d0 <= *local_f0)) {
        pcVar11 = "Rowid %lld out of order (min less than parent max of %lld)";
LAB_00146b5d:
        checkAppendMsg(pCheck,local_98,pcVar11);
      }
    }
    else if (local_f0 == (long *)0x0) {
      if (*local_d8 < local_100) {
        pcVar11 = "Rowid %lld out of order (max larger than parent min of %lld)";
        goto LAB_00146b5d;
      }
    }
    else {
      if (local_d0 <= *local_d8) {
        checkAppendMsg(pCheck,local_98,"Rowid %lld out of order (min less than parent min of %lld)")
        ;
      }
      if (*local_f0 < local_100) {
        checkAppendMsg(pCheck,local_98,
                       "Rowid %lld out of order (max larger than parent max of %lld)");
      }
      *local_d8 = local_100;
    }
  }
  puVar3 = local_c0->aData;
  uVar14 = (ulong)local_c0->hdrOffset;
  __s = pcache1Alloc(pBt->pageSize);
  if (__s == (void *)0x0) {
    pCheck->mallocFailed = 1;
  }
  else {
    uVar16 = ((uint)puVar3[uVar14 + 6] + (uint)puVar3[uVar14 + 5] * 0x100) - 1 & 0xffff;
    local_e0 = pCheck;
    memset((void *)((long)__s + (ulong)uVar16 + 1),0,(long)(int)(~uVar16 + (int)local_e8));
    local_f8 = __s;
    memset(__s,1,(ulong)uVar16 + 1);
    uVar5 = *(ushort *)(puVar3 + uVar14 + 3) << 8 | *(ushort *)(puVar3 + uVar14 + 3) >> 8;
    local_c8 = uVar14;
    if (uVar5 != 0) {
      lVar10 = uVar14 + (ulong)local_c0->leaf * -4;
      local_f0 = (long *)CONCAT44(local_f0._4_4_,(int)local_e8 + -4);
      local_d8 = (long *)(ulong)uVar5;
      plVar15 = (long *)0x0;
      do {
        bVar1 = puVar3[(long)plVar15 * 2 + lVar10 + 0xc];
        bVar2 = puVar3[(long)plVar15 * 2 + lVar10 + 0xd];
        uVar8 = (uint)bVar2 + (uint)bVar1 * 0x100;
        uVar16 = 0x10000;
        if ((int)uVar8 <= (int)local_f0) {
          uVar6 = cellSizePtr(local_c0,puVar3 + uVar8);
          uVar16 = (uint)uVar6;
        }
        iVar9 = uVar16 + uVar8;
        if ((int)local_e8 < iVar9) {
          checkAppendMsg(local_e0,(char *)0x0,"Corruption detected in cell %d on page %d",
                         (ulong)plVar15 & 0xffffffff,(ulong)(uint)iPage);
        }
        else if (uVar16 != 0) {
          pcVar11 = (char *)((ulong)((uVar16 + (uint)bVar1 * 0x100 + (uint)bVar2) - 1) +
                            (long)local_f8);
          do {
            *pcVar11 = *pcVar11 + '\x01';
            iVar9 = iVar9 + -1;
            pcVar11 = pcVar11 + -1;
          } while ((int)uVar8 < iVar9);
        }
        plVar15 = (long *)((long)plVar15 + 1);
      } while (plVar15 != local_d8);
    }
    pCheck_00 = local_e0;
    uVar5 = *(ushort *)(puVar3 + local_c8 + 1) << 8 | *(ushort *)(puVar3 + local_c8 + 1) >> 8;
    while (uVar5 != 0) {
      uVar16 = (uint)uVar5;
      uVar8 = (uint)CONCAT11(puVar3[(ulong)uVar16 + 2],puVar3[(ulong)uVar16 + 3]);
      if (uVar8 != 0) {
        iVar9 = uVar8 + uVar16;
        pcVar11 = (char *)((ulong)(((uint)puVar3[(ulong)uVar16 + 2] * 0x100 + uVar16 +
                                   (uint)puVar3[(ulong)uVar16 + 3]) - 1) + (long)local_f8);
        do {
          *pcVar11 = *pcVar11 + '\x01';
          iVar9 = iVar9 + -1;
          pcVar11 = pcVar11 + -1;
        } while ((int)uVar16 < iVar9);
      }
      uVar5 = *(ushort *)(puVar3 + uVar16) << 8 | *(ushort *)(puVar3 + uVar16) >> 8;
    }
    if ((int)local_e8 < 1) {
      uVar16 = 0;
    }
    else {
      uVar14 = 0;
      uVar16 = 0;
      do {
        if (*(char *)((long)local_f8 + uVar14) == '\0') {
          uVar16 = uVar16 + 1;
        }
        else if ('\x01' < *(char *)((long)local_f8 + uVar14)) {
          checkAppendMsg(local_e0,(char *)0x0,"Multiple uses for byte %d of page %d",uVar14,
                         (ulong)(uint)iPage);
          break;
        }
        uVar14 = uVar14 + 1;
      } while (local_e8 != uVar14);
    }
    __s = local_f8;
    if (uVar16 != puVar3[local_c8 + 7]) {
      checkAppendMsg(pCheck_00,(char *)0x0,"Fragmentation of %d bytes reported as %d on page %d",
                     (ulong)uVar16,(ulong)puVar3[local_c8 + 7],(ulong)(uint)iPage);
      __s = local_f8;
    }
  }
  pcache1Free(__s);
LAB_00146db8:
  sqlite3PagerUnref(local_c0->pDbPage);
  return iVar7;
}

Assistant:

static int checkTreePage(
  IntegrityCk *pCheck,  /* Context for the sanity check */
  int iPage,            /* Page number of the page to check */
  char *zParentContext, /* Parent context */
  i64 *pnParentMinKey, 
  i64 *pnParentMaxKey
){
  MemPage *pPage;
  int i, rc, depth, d2, pgno, cnt;
  int hdr, cellStart;
  int nCell;
  u8 *data;
  BtShared *pBt;
  int usableSize;
  char zContext[100];
  char *hit = 0;
  i64 nMinKey = 0;
  i64 nMaxKey = 0;

  sqlite3_snprintf(sizeof(zContext), zContext, "Page %d: ", iPage);

  /* Check that the page exists
  */
  pBt = pCheck->pBt;
  usableSize = pBt->usableSize;
  if( iPage==0 ) return 0;
  if( checkRef(pCheck, iPage, zParentContext) ) return 0;
  if( (rc = btreeGetPage(pBt, (Pgno)iPage, &pPage, 0, 0))!=0 ){
    checkAppendMsg(pCheck, zContext,
       "unable to get the page. error code=%d", rc);
    return 0;
  }

  /* Clear MemPage.isInit to make sure the corruption detection code in
  ** btreeInitPage() is executed.  */
  pPage->isInit = 0;
  if( (rc = btreeInitPage(pPage))!=0 ){
    assert( rc==SQLITE_CORRUPT );  /* The only possible error from InitPage */
    checkAppendMsg(pCheck, zContext, 
                   "btreeInitPage() returns error code %d", rc);
    releasePage(pPage);
    return 0;
  }

  /* Check out all the cells.
  */
  depth = 0;
  for(i=0; i<pPage->nCell && pCheck->mxErr; i++){
    u8 *pCell;
    u32 sz;
    CellInfo info;

    /* Check payload overflow pages
    */
    sqlite3_snprintf(sizeof(zContext), zContext,
             "On tree page %d cell %d: ", iPage, i);
    pCell = findCell(pPage,i);
    btreeParseCellPtr(pPage, pCell, &info);
    sz = info.nData;
    if( !pPage->intKey ) sz += (int)info.nKey;
    /* For intKey pages, check that the keys are in order.
    */
    else if( i==0 ) nMinKey = nMaxKey = info.nKey;
    else{
      if( info.nKey <= nMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (previous was %lld)", info.nKey, nMaxKey);
      }
      nMaxKey = info.nKey;
    }
    assert( sz==info.nPayload );
    if( (sz>info.nLocal) 
     && (&pCell[info.iOverflow]<=&pPage->aData[pBt->usableSize])
    ){
      int nPage = (sz - info.nLocal + usableSize - 5)/(usableSize - 4);
      Pgno pgnoOvfl = get4byte(&pCell[info.iOverflow]);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgnoOvfl, PTRMAP_OVERFLOW1, iPage, zContext);
      }
#endif
      checkList(pCheck, 0, pgnoOvfl, nPage, zContext);
    }

    /* Check sanity of left child page.
    */
    if( !pPage->leaf ){
      pgno = get4byte(pCell);
#ifndef SQLITE_OMIT_AUTOVACUUM
      if( pBt->autoVacuum ){
        checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
      }
#endif
      d2 = checkTreePage(pCheck, pgno, zContext, &nMinKey, i==0 ? NULL : &nMaxKey);
      if( i>0 && d2!=depth ){
        checkAppendMsg(pCheck, zContext, "Child page depth differs");
      }
      depth = d2;
    }
  }

  if( !pPage->leaf ){
    pgno = get4byte(&pPage->aData[pPage->hdrOffset+8]);
    sqlite3_snprintf(sizeof(zContext), zContext, 
                     "On page %d at right child: ", iPage);
#ifndef SQLITE_OMIT_AUTOVACUUM
    if( pBt->autoVacuum ){
      checkPtrmap(pCheck, pgno, PTRMAP_BTREE, iPage, zContext);
    }
#endif
    checkTreePage(pCheck, pgno, zContext, NULL, !pPage->nCell ? NULL : &nMaxKey);
  }
 
  /* For intKey leaf pages, check that the min/max keys are in order
  ** with any left/parent/right pages.
  */
  if( pPage->leaf && pPage->intKey ){
    /* if we are a left child page */
    if( pnParentMinKey ){
      /* if we are the left most child page */
      if( !pnParentMaxKey ){
        if( nMaxKey > *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent min of %lld)",
              nMaxKey, *pnParentMinKey);
        }
      }else{
        if( nMinKey <= *pnParentMinKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (min less than parent min of %lld)",
              nMinKey, *pnParentMinKey);
        }
        if( nMaxKey > *pnParentMaxKey ){
          checkAppendMsg(pCheck, zContext, 
              "Rowid %lld out of order (max larger than parent max of %lld)",
              nMaxKey, *pnParentMaxKey);
        }
        *pnParentMinKey = nMaxKey;
      }
    /* else if we're a right child page */
    } else if( pnParentMaxKey ){
      if( nMinKey <= *pnParentMaxKey ){
        checkAppendMsg(pCheck, zContext, 
            "Rowid %lld out of order (min less than parent max of %lld)",
            nMinKey, *pnParentMaxKey);
      }
    }
  }

  /* Check for complete coverage of the page
  */
  data = pPage->aData;
  hdr = pPage->hdrOffset;
  hit = sqlite3PageMalloc( pBt->pageSize );
  if( hit==0 ){
    pCheck->mallocFailed = 1;
  }else{
    int contentOffset = get2byteNotZero(&data[hdr+5]);
    assert( contentOffset<=usableSize );  /* Enforced by btreeInitPage() */
    memset(hit+contentOffset, 0, usableSize-contentOffset);
    memset(hit, 1, contentOffset);
    nCell = get2byte(&data[hdr+3]);
    cellStart = hdr + 12 - 4*pPage->leaf;
    for(i=0; i<nCell; i++){
      int pc = get2byte(&data[cellStart+i*2]);
      u32 size = 65536;
      int j;
      if( pc<=usableSize-4 ){
        size = cellSizePtr(pPage, &data[pc]);
      }
      if( (int)(pc+size-1)>=usableSize ){
        checkAppendMsg(pCheck, 0, 
            "Corruption detected in cell %d on page %d",i,iPage);
      }else{
        for(j=pc+size-1; j>=pc; j--) hit[j]++;
      }
    }
    i = get2byte(&data[hdr+1]);
    while( i>0 ){
      int size, j;
      assert( i<=usableSize-4 );     /* Enforced by btreeInitPage() */
      size = get2byte(&data[i+2]);
      assert( i+size<=usableSize );  /* Enforced by btreeInitPage() */
      for(j=i+size-1; j>=i; j--) hit[j]++;
      j = get2byte(&data[i]);
      assert( j==0 || j>i+size );  /* Enforced by btreeInitPage() */
      assert( j<=usableSize-4 );   /* Enforced by btreeInitPage() */
      i = j;
    }
    for(i=cnt=0; i<usableSize; i++){
      if( hit[i]==0 ){
        cnt++;
      }else if( hit[i]>1 ){
        checkAppendMsg(pCheck, 0,
          "Multiple uses for byte %d of page %d", i, iPage);
        break;
      }
    }
    if( cnt!=data[hdr+7] ){
      checkAppendMsg(pCheck, 0, 
          "Fragmentation of %d bytes reported as %d on page %d",
          cnt, data[hdr+7], iPage);
    }
  }
  sqlite3PageFree(hit);
  releasePage(pPage);
  return depth+1;
}